

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O1

void __thiscall fizplex::Simplex::solve(Simplex *this)

{
  DVector *this_00;
  LP *pLVar1;
  size_t sVar2;
  double dVar3;
  Candidate candidate_00;
  Candidate candidate_01;
  Candidate candidate_02;
  RatioTestResult rt_00;
  RatioTestResult rt_01;
  Result RVar4;
  double *pdVar5;
  int round;
  double *__src;
  IterationDecision iteration_decision;
  Candidate candidate;
  RatioTestResult rt;
  Base base;
  IterationDecision local_bc;
  Candidate local_b8;
  double local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  RatioTestResult local_90;
  Base local_70;
  
  set_initial_x(this);
  local_98 = &this->basic_indices;
  this_00 = &this->c;
  round = 0;
  do {
    Base::Base(&local_70,this->lp,local_98);
    set_basic_solution(this,&local_70);
    if (this->phase == One) {
      set_phase_one_objective(this);
    }
    dVar3 = DVector::operator*(this_00,&this->x);
    this->z = dVar3;
    run_price(&local_b8,this,&local_70);
    local_bc = Unfinished;
    if (local_b8.is_optimal == true) {
      local_bc = decision_for_optimality(this);
    }
    candidate_00._1_7_ = local_b8._1_7_;
    candidate_00.is_optimal = local_b8.is_optimal;
    candidate_00.index = local_b8.index;
    candidate_00.cost = local_b8.cost;
    run_ratio_test(&local_90,this,candidate_00,&local_70);
    if (local_bc == Unfinished) {
      local_bc = local_90.result;
    }
    if (0 < this->print_level) {
      print_iteration_results(this,&local_bc,round);
    }
    switch(local_bc) {
    case Unbounded:
      rt_01._4_4_ = local_90._4_4_;
      rt_01.result = local_90.result;
      candidate_02._1_7_ = local_b8._1_7_;
      candidate_02.is_optimal = local_b8.is_optimal;
      candidate_02.index = local_b8.index;
      candidate_02.cost = local_b8.cost;
      rt_01.leaving_index = local_90.leaving_index;
      rt_01.step_length = local_90.step_length;
      rt_01.leaving_bound = local_90.leaving_bound;
      set_result_for_unbounded(this,candidate_02,rt_01);
      goto LAB_00176375;
    case BoundFlip:
      local_a0 = local_90.step_length;
      pdVar5 = DVector::operator[](&this->x,local_b8.index);
      *pdVar5 = local_a0 + *pdVar5;
      break;
    case BaseChange:
      rt_00._4_4_ = local_90._4_4_;
      rt_00.result = local_90.result;
      candidate_01._1_7_ = local_b8._1_7_;
      candidate_01.is_optimal = local_b8.is_optimal;
      candidate_01.index = local_b8.index;
      candidate_01.cost = local_b8.cost;
      rt_00.leaving_index = local_90.leaving_index;
      rt_00.step_length = local_90.step_length;
      rt_00.leaving_bound = local_90.leaving_bound;
      exchange_base_column(this,candidate_01,rt_00);
      break;
    case OptimalSolution:
      RVar4 = OptimalSolution;
      goto LAB_00176372;
    case SwitchToPhaseTwo:
      this->phase = Two;
      pLVar1 = this->lp;
      sVar2 = (this->c).vals._M_size;
      if (sVar2 == (pLVar1->c).vals._M_size) {
        if (sVar2 != 0) {
          pdVar5 = (this->c).vals._M_data;
          __src = (pLVar1->c).vals._M_data;
LAB_001762e6:
          memcpy(pdVar5,__src,sVar2 << 3);
        }
      }
      else {
        pdVar5 = (this->c).vals._M_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete(pdVar5);
        }
        sVar2 = (pLVar1->c).vals._M_size;
        (this_00->vals)._M_size = sVar2;
        pdVar5 = (double *)operator_new(sVar2 << 3);
        (this->c).vals._M_data = pdVar5;
        __src = (pLVar1->c).vals._M_data;
        if (__src != (double *)0x0) {
          sVar2 = (this_00->vals)._M_size;
          goto LAB_001762e6;
        }
      }
      (this->c).dim = (pLVar1->c).dim;
      break;
    case Infeasible:
      RVar4 = Infeasible;
LAB_00176372:
      this->result = RVar4;
LAB_00176375:
      if (local_70.row_ordering._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
        operator_delete__((void *)local_70.row_ordering._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                  .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
      }
      local_70.row_ordering._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      operator_delete(local_70.work.vals._M_data);
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector(&local_70.etms);
      return;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                    ,0x59,"void fizplex::Simplex::solve()");
    }
    if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
        local_70.row_ordering._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
      operator_delete__((void *)local_70.row_ordering._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    }
    local_70.row_ordering._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
         (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
    operator_delete(local_70.work.vals._M_data);
    std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector(&local_70.etms);
    round = round + 1;
    if (round == 5000) {
      return;
    }
  } while( true );
}

Assistant:

void Simplex::solve() {
  set_initial_x();

  for (int round = 0; round < max_rounds; round++) {
    Base base(lp, basic_indices);
    set_basic_solution(base);

    if (phase == Simplex::Phase::One)
      set_phase_one_objective();
    z = c * x;

    const auto candidate = run_price(base);

    IterationDecision iteration_decision = IterationDecision::Unfinished;
    if (candidate.is_optimal)
      iteration_decision = decision_for_optimality();

    const auto rt = run_ratio_test(candidate, base);
    if (iteration_decision == IterationDecision::Unfinished)
      iteration_decision = rt.result;

    if (print_level > 0)
      print_iteration_results(iteration_decision, round);

    switch (iteration_decision) {
    case IterationDecision::BaseChange: {
      exchange_base_column(candidate, rt);
      break;
    }
    case IterationDecision::Unbounded:
      set_result_for_unbounded(candidate, rt);
      return;
    case IterationDecision::BoundFlip:
      x[candidate.index] += rt.step_length;
      break;
    case IterationDecision::OptimalSolution:
      result = Result::OptimalSolution;
      return;
    case IterationDecision::SwitchToPhaseTwo:
      phase = Simplex::Phase::Two;
      c = lp.c;
      break;
    case IterationDecision::Infeasible:
      result = Result::Infeasible;
      return;
    default:
      assert(false);
    }
  }
}